

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<$_6::TEMPNAMEPLACEHOLDERVALUE(lest::env&)const::logic_t_const&>::operator()
          (result *__return_storage_ptr__,
          expression_lhs<__6::TEMPNAMEPLACEHOLDERVALUE(lest::env&)const::logic_t_const&> *this,
          logic_t *rhs)

{
  int iVar1;
  int iVar2;
  lest *this_00;
  ostream *poVar3;
  logic_t *item;
  logic_t *item_00;
  ostringstream os;
  ulong *local_290;
  ulong local_280;
  undefined8 uStack_278;
  long *local_270;
  long local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  undefined8 uStack_258;
  ForNonContainerNonPointer<logic_t,_std::string> local_250;
  long *local_230;
  long local_228;
  long local_220;
  undefined8 uStack_218;
  ulong *local_210;
  size_type local_208;
  ulong local_200;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  bool local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  ForNonContainerNonPointer<logic_t,_std::string> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this_00 = *(lest **)this;
  iVar1 = rhs->value;
  iVar2 = *(int *)this_00;
  local_270 = (long *)&local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"==","");
  if (local_270 == (long *)&local_260) {
    uStack_218 = uStack_258;
    local_230 = &local_220;
  }
  else {
    local_230 = local_270;
  }
  local_220 = CONCAT71(uStack_25f,local_260);
  local_228 = local_268;
  local_268 = 0;
  local_260 = 0;
  local_270 = (long *)&local_260;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  lest::operator()(&local_250,this_00,item);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_230,local_228);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  lest::operator()(&local_1c8,(lest *)rhs,item_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p == &local_250.field_2) {
    uStack_278 = local_250.field_2._8_8_;
    local_290 = &local_280;
  }
  else {
    local_290 = (ulong *)local_250._M_dataplus._M_p;
  }
  local_280 = local_250.field_2._M_allocated_capacity;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  if (local_290 == &local_280) {
    uStack_1f8 = (undefined4)uStack_278;
    uStack_1f4 = uStack_278._4_4_;
    local_210 = &local_200;
  }
  else {
    local_210 = local_290;
  }
  local_200 = local_280;
  local_1f0 = iVar2 == iVar1;
  local_208 = local_250._M_string_length;
  local_280 = local_280 & 0xffffffffffffff00;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_210,(long)local_210 + local_250._M_string_length);
  __return_storage_ptr__->passed = local_1f0;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_1e8,local_1e0 + (long)local_1e8)
  ;
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if (local_270 != (long *)&local_260) {
    operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }